

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

int is_coded_lossless(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  int i;
  int coded_lossless;
  MACROBLOCKD *xd_local;
  AV1_COMMON *cm_local;
  
  coded_lossless = 1;
  if ((cm->seg).enabled == '\0') {
    coded_lossless = xd->lossless[0];
  }
  else {
    for (i = 0; i < 8; i = i + 1) {
      if (xd->lossless[i] == 0) {
        return 0;
      }
    }
  }
  return coded_lossless;
}

Assistant:

static inline int is_coded_lossless(const AV1_COMMON *cm,
                                    const MACROBLOCKD *xd) {
  int coded_lossless = 1;
  if (cm->seg.enabled) {
    for (int i = 0; i < MAX_SEGMENTS; ++i) {
      if (!xd->lossless[i]) {
        coded_lossless = 0;
        break;
      }
    }
  } else {
    coded_lossless = xd->lossless[0];
  }
  return coded_lossless;
}